

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O3

void __thiscall re2c::Cases::~Cases(Cases *this)

{
  Case *pCVar1;
  State *pSVar2;
  void *pvVar3;
  long lVar4;
  
  pCVar1 = this->cases;
  if (pCVar1 != (Case *)0x0) {
    pSVar2 = pCVar1[-1].to;
    if (pSVar2 != (State *)0x0) {
      lVar4 = (long)pSVar2 << 5;
      do {
        pvVar3 = *(void **)((long)&pCVar1[-1].ranges.
                                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar4);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)pCVar1 + lVar4 + -0x10) - (long)pvVar3);
        }
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__(&pCVar1[-1].to,(long)pSVar2 << 5 | 8);
    return;
  }
  return;
}

Assistant:

Cases::~Cases ()
{
	delete [] cases;
}